

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  _Bool connected;
  void *pvVar1;
  curl_wildcard_dtor p_Var2;
  undefined8 *puVar3;
  Curl_easy *data;
  CURLcode CVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  ftp_parselist_data **parserp;
  ftp_parselist_data *pfVar8;
  curl_wildcard_states cVar9;
  Curl_easy *pCVar10;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  pCVar10 = conn->data;
  if ((pCVar10->state).wildcardmatch == true) {
LAB_00114b61:
    switch((pCVar10->wildcard).state) {
    case CURLWC_CLEAR:
    case CURLWC_ERROR:
    case CURLWC_DONE:
      goto switchD_00114b7b_caseD_0;
    case CURLWC_INIT:
      pvVar1 = (pCVar10->req).protop;
      pcVar5 = *(char **)((long)pvVar1 + 0x18);
      pcVar7 = strrchr(pcVar5,0x2f);
      if (pcVar7 == (char *)0x0) {
        if (*pcVar5 == '\0') goto LAB_00114f09;
        pcVar7 = (*Curl_cstrdup)(pcVar5);
        (pCVar10->wildcard).pattern = pcVar7;
LAB_00114e6e:
        if (pcVar7 == (char *)0x0) {
          CVar4 = CURLE_OUT_OF_MEMORY;
        }
        else {
          *pcVar5 = '\0';
          parserp = (ftp_parselist_data **)(*Curl_ccalloc)(1,0x18);
          if (parserp == (ftp_parselist_data **)0x0) {
            CVar4 = CURLE_OUT_OF_MEMORY;
          }
          else {
            pfVar8 = Curl_ftp_parselist_data_alloc();
            *parserp = pfVar8;
            CVar4 = CURLE_OUT_OF_MEMORY;
            if (pfVar8 != (ftp_parselist_data *)0x0) {
              (pCVar10->wildcard).protdata = parserp;
              (pCVar10->wildcard).dtor = wc_data_dtor;
              if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
                (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
              }
              CVar4 = ftp_parse_url_path(conn);
              if (CVar4 == CURLE_OK) {
                pcVar5 = (*Curl_cstrdup)(*(char **)((long)pvVar1 + 0x18));
                (pCVar10->wildcard).path = pcVar5;
                CVar4 = CURLE_OUT_OF_MEMORY;
                if (pcVar5 != (char *)0x0) {
                  data = conn->data;
                  parserp[1] = (ftp_parselist_data *)(data->set).fwrite_func;
                  (data->set).fwrite_func = Curl_ftp_parselist;
                  parserp[2] = (ftp_parselist_data *)(data->set).out;
                  (data->set).out = conn;
                  CVar4 = CURLE_OK;
                  Curl_infof(data,"Wildcard - Parsing started\n");
                  goto LAB_00114f85;
                }
              }
            }
            Curl_ftp_parselist_data_free(parserp);
            (*Curl_cfree)(parserp);
          }
          (*Curl_cfree)((pCVar10->wildcard).pattern);
          (pCVar10->wildcard).pattern = (char *)0x0;
          (pCVar10->wildcard).protdata = (void *)0x0;
          (pCVar10->wildcard).dtor = (curl_wildcard_dtor)0x0;
        }
      }
      else {
        if (pcVar7[1] != '\0') {
          pcVar5 = pcVar7 + 1;
          pcVar7 = (*Curl_cstrdup)(pcVar5);
          (pCVar10->wildcard).pattern = pcVar7;
          goto LAB_00114e6e;
        }
LAB_00114f09:
        (pCVar10->wildcard).state = CURLWC_CLEAN;
        CVar4 = ftp_parse_url_path(conn);
      }
LAB_00114f85:
      if ((pCVar10->wildcard).state == CURLWC_CLEAN) goto LAB_00114fa5;
      cVar9 = (uint)(CVar4 != CURLE_OK) * 4 + CURLWC_MATCHING;
      break;
    case CURLWC_MATCHING:
      puVar3 = (undefined8 *)(pCVar10->wildcard).protdata;
      (pCVar10->set).fwrite_func = (curl_write_callback)puVar3[1];
      (pCVar10->set).out = (void *)puVar3[2];
      puVar3[1] = 0;
      puVar3[2] = 0;
      (pCVar10->wildcard).state = CURLWC_DOWNLOADING;
      CVar4 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
      cVar9 = CURLWC_CLEAN;
      if (CVar4 != CURLE_OK) goto LAB_00114d1f;
      if ((pCVar10->wildcard).filelist.size != 0) goto LAB_00114d26;
      (pCVar10->wildcard).state = CURLWC_CLEAN;
      CVar4 = CURLE_REMOTE_FILE_NOT_FOUND;
      goto LAB_00114fa5;
    case CURLWC_DOWNLOADING:
      puVar3 = (undefined8 *)((pCVar10->wildcard).filelist.head)->ptr;
      pvVar1 = (pCVar10->req).protop;
      pcVar5 = curl_maprintf("%s%s",(pCVar10->wildcard).path,*puVar3);
      if (pcVar5 == (char *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
      }
      else {
        (*Curl_cfree)(*(void **)((long)pvVar1 + 0x20));
        *(char **)((long)pvVar1 + 0x18) = pcVar5;
        *(char **)((long)pvVar1 + 0x20) = pcVar5;
        Curl_infof(conn->data,"Wildcard - START of \"%s\"\n",*puVar3);
        if ((conn->data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
          Curl_set_in_callback(conn->data,true);
          lVar6 = (*(conn->data->set).chunk_bgn)
                            (puVar3,(pCVar10->wildcard).customptr,
                             (int)(pCVar10->wildcard).filelist.size);
          Curl_set_in_callback(conn->data,false);
          if (lVar6 == 2) {
            Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar3);
            cVar9 = CURLWC_SKIP;
            goto LAB_00114d1f;
          }
          if (lVar6 == 1) {
            CVar4 = CURLE_CHUNK_FAILED;
            goto LAB_00114fa5;
          }
        }
        cVar9 = CURLWC_SKIP;
        if (*(int *)(puVar3 + 1) != 0) goto LAB_00114d1f;
        if ((*(byte *)(puVar3 + 0xc) & 0x40) != 0) {
          (conn->proto).ftpc.known_filesize = puVar3[5];
        }
        CVar4 = ftp_parse_url_path(conn);
        if (CVar4 == CURLE_OK) {
          Curl_llist_remove(&(pCVar10->wildcard).filelist,(pCVar10->wildcard).filelist.head,
                            (void *)0x0);
          CVar4 = CURLE_OK;
          if ((pCVar10->wildcard).filelist.size == 0) {
            (pCVar10->wildcard).state = CURLWC_CLEAN;
            CVar4 = CURLE_OK;
          }
        }
      }
      goto LAB_00114fa5;
    case CURLWC_CLEAN:
      puVar3 = (undefined8 *)(pCVar10->wildcard).protdata;
      if (puVar3 == (undefined8 *)0x0) {
        cVar9 = CURLWC_DONE;
        CVar4 = CURLE_OK;
      }
      else {
        CVar4 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
        cVar9 = (CVar4 == CURLE_OK) + CURLWC_ERROR;
      }
      break;
    case CURLWC_SKIP:
      if ((pCVar10->set).chunk_end != (curl_chunk_end_callback)0x0) {
        Curl_set_in_callback(pCVar10,true);
        (*(conn->data->set).chunk_end)((conn->data->wildcard).customptr);
        Curl_set_in_callback(conn->data,false);
      }
      Curl_llist_remove(&(pCVar10->wildcard).filelist,(pCVar10->wildcard).filelist.head,(void *)0x0)
      ;
      cVar9 = ((pCVar10->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
LAB_00114d1f:
      (pCVar10->wildcard).state = cVar9;
LAB_00114d26:
      pCVar10 = conn->data;
      goto LAB_00114b61;
    default:
      goto switchD_00114b7b_default;
    }
    (pCVar10->wildcard).state = cVar9;
    goto LAB_00114fa5;
  }
  CVar4 = ftp_parse_url_path(conn);
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  pCVar10 = conn->data;
LAB_00114fc8:
  (pCVar10->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar10,0);
  Curl_pgrsSetDownloadCounter(pCVar10,0);
  Curl_pgrsSetUploadSize(pCVar10,-1);
  Curl_pgrsSetDownloadSize(pCVar10,-1);
  (conn->proto).ftpc.ctl_valid = true;
  if ((conn->data->set).opt_no_body == true) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x28) = 1;
  }
  *done = false;
  CVar4 = ftp_state_quote(conn,true,FTP_QUOTE);
  if (CVar4 == CURLE_OK) {
    CVar4 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false,false);
    *done = (conn->proto).ftpc.state == FTP_STOP;
    connected = (conn->bits).tcpconnect[1];
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    if (CVar4 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar4 = ftp_dophase_done(conn,connected);
      return CVar4;
    }
  }
  freedirs(&(conn->proto).ftpc);
  return CVar4;
switchD_00114b7b_caseD_0:
  p_Var2 = (pCVar10->wildcard).dtor;
  CVar4 = CURLE_OK;
  if (p_Var2 != (curl_wildcard_dtor)0x0) {
    (*p_Var2)((pCVar10->wildcard).protdata);
switchD_00114b7b_default:
    CVar4 = CURLE_OK;
  }
LAB_00114fa5:
  pCVar10 = conn->data;
  if (((pCVar10->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  goto LAB_00114fc8;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->state.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}